

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  BYTE *pBVar1;
  ushort *puVar2;
  BYTE *pBVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  ushort *puVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  ushort *puVar14;
  BYTE *pBVar15;
  ushort *puVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  uint uVar19;
  BYTE *pBVar20;
  BYTE *dstEnd;
  BYTE *pBVar21;
  BYTE *d;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  BYTE *s;
  ushort *puVar25;
  ushort *puVar26;
  
  iVar24 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar24 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pBVar15 = (BYTE *)(dest + -prefixSize);
      puVar2 = (ushort *)(source + compressedSize);
      pBVar3 = (BYTE *)(dest + maxOutputSize);
      puVar14 = (ushort *)source;
      dstEnd = (BYTE *)dest;
      if (maxOutputSize < 0x40) goto LAB_0010b8c0;
LAB_0010b4a4:
      puVar26 = (ushort *)((long)puVar14 + 1);
      bVar4 = (byte)*puVar14;
      uVar9 = (uint)bVar4;
      uVar23 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        if ((ushort *)((long)puVar2 - 0xfU) <= puVar26) goto LAB_0010b8f6;
        puVar16 = puVar14 + 1;
        uVar19 = 0;
        puVar14 = puVar14 + 8;
        do {
          puVar25 = puVar26;
          puVar10 = puVar14;
          puVar26 = (ushort *)((long)puVar25 + 1);
          uVar19 = uVar19 + *(byte *)((long)puVar10 + -0xf);
          puVar16 = (ushort *)((long)puVar16 + 1);
          puVar14 = (ushort *)((long)puVar10 + 1);
        } while (puVar10 + -7 < (ushort *)((long)puVar2 - 0xfU) &&
                 *(byte *)((long)puVar10 + -0xf) == 0xff);
        uVar23 = (ulong)uVar19 + 0xf;
        pBVar20 = dstEnd + uVar23;
        if ((CARRY8((ulong)dstEnd,uVar23)) || ((ulong)-(long)puVar16 < uVar23)) {
          puVar26 = puVar10 + -7;
          goto LAB_0010b8f6;
        }
        if (dest + (long)maxOutputSize + -0x20 < pBVar20) goto LAB_0010b7c1;
        puVar14 = (ushort *)((ulong)uVar19 + (long)puVar10 + 1);
        if (puVar2 + -0x10 < puVar14) {
          puVar26 = puVar10 + -7;
          goto LAB_0010b7c1;
        }
        lVar11 = 0;
        do {
          uVar7 = *(undefined8 *)((byte *)((long)puVar26 + lVar11) + 8);
          pBVar17 = dstEnd + lVar11;
          *(undefined8 *)pBVar17 = *(undefined8 *)((long)puVar26 + lVar11);
          *(undefined8 *)(pBVar17 + 8) = uVar7;
          pbVar13 = (byte *)((long)puVar25 + lVar11 + 0x11);
          uVar7 = *(undefined8 *)(pbVar13 + 8);
          *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)pbVar13;
          *(undefined8 *)(pBVar17 + 0x18) = uVar7;
          lVar11 = lVar11 + 0x20;
        } while (pBVar17 + 0x20 < pBVar20);
      }
      else {
        pBVar20 = dstEnd + uVar23;
        if ((ushort *)((long)puVar2 - 0x11U) < puVar26) goto LAB_0010b7c1;
        uVar7 = *(undefined8 *)((long)puVar14 + 9);
        *(undefined8 *)dstEnd = *(undefined8 *)puVar26;
        *(undefined8 *)(dstEnd + 8) = uVar7;
        puVar14 = (ushort *)(uVar23 + (long)puVar26);
      }
      uVar6 = *puVar14;
      uVar12 = (ulong)uVar6;
      puVar14 = puVar14 + 1;
      pBVar17 = pBVar20 + -uVar12;
      uVar22 = (ulong)(bVar4 & 0xf);
      if (uVar22 == 0xf) {
        puVar26 = puVar14;
        if (pBVar17 < pBVar15) goto LAB_0010b8f6;
        uVar9 = 0;
        puVar16 = puVar14;
        do {
          puVar14 = (ushort *)((long)puVar16 + 1);
          puVar26 = puVar14;
          if (puVar2 + -2 <= puVar14) goto LAB_0010b8f6;
          uVar8 = *puVar16;
          uVar9 = uVar9 + (byte)uVar8;
          puVar16 = puVar14;
        } while ((byte)uVar8 == 0xff);
        uVar23 = (ulong)uVar9;
        if ((BYTE *)(-uVar23 - 0x10) < pBVar20) goto LAB_0010b8f6;
        uVar22 = uVar23 + 0x13;
        if (pBVar3 + -0x40 <= pBVar20 + uVar23 + 0x13) goto LAB_0010b84d;
LAB_0010b625:
        puVar26 = puVar14;
        if (pBVar17 < pBVar15) goto LAB_0010b8f6;
        dstEnd = pBVar20 + uVar22;
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset(pBVar20,pBVar17,dstEnd,uVar12);
        }
        else {
          do {
            uVar7 = *(undefined8 *)(pBVar20 + -uVar12 + 8);
            *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar20 + -uVar12);
            *(undefined8 *)(pBVar20 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar20 + -uVar12 + 0x10 + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar20 + -uVar12 + 0x10);
            *(undefined8 *)(pBVar20 + 0x18) = uVar7;
            pBVar20 = pBVar20 + 0x20;
          } while (pBVar20 < dstEnd);
        }
      }
      else {
        dstEnd = pBVar20 + uVar22 + 4;
        uVar22 = uVar22 + 4;
        if (pBVar3 + -0x40 <= dstEnd) goto LAB_0010b84d;
        if ((pBVar17 < pBVar15) || (uVar6 < 8)) goto LAB_0010b625;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
        *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar17 + 8);
        *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
      }
      goto LAB_0010b4a4;
    }
  }
  return iVar24;
LAB_0010b84d:
  puVar26 = puVar14;
  if (pBVar17 < pBVar15) {
LAB_0010b8f6:
    return ~(uint)puVar26 + (int)source;
  }
  dstEnd = pBVar20 + uVar22;
  if ((uint)uVar12 < 8) {
    pBVar20[0] = '\0';
    pBVar20[1] = '\0';
    pBVar20[2] = '\0';
    pBVar20[3] = '\0';
    *pBVar20 = *pBVar17;
    pBVar20[1] = pBVar17[1];
    pBVar20[2] = pBVar17[2];
    pBVar20[3] = pBVar17[3];
    uVar23 = (ulong)((uint)uVar12 << 2);
    uVar12 = (ulong)*(uint *)((long)inc32table + uVar23);
    *(undefined4 *)(pBVar20 + 4) = *(undefined4 *)(pBVar17 + uVar12);
    pBVar17 = pBVar17 + (uVar12 - (long)*(int *)((long)dec64table + uVar23));
  }
  else {
    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
    pBVar17 = pBVar17 + 8;
  }
  pBVar1 = pBVar20 + 8;
  if (pBVar3 + -0xc < dstEnd) {
    if (pBVar3 + -5 < dstEnd) goto LAB_0010b8f6;
    pBVar20 = pBVar3 + -7;
    pBVar18 = pBVar17;
    pBVar21 = pBVar1;
    if (pBVar1 < pBVar20) {
      do {
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar18;
        pBVar21 = pBVar21 + 8;
        pBVar18 = pBVar18 + 8;
      } while (pBVar21 < pBVar20);
      pBVar17 = pBVar17 + ((long)pBVar20 - (long)pBVar1);
      pBVar1 = pBVar20;
    }
    for (; pBVar1 < dstEnd; pBVar1 = pBVar1 + 1) {
      BVar5 = *pBVar17;
      pBVar17 = pBVar17 + 1;
      *pBVar1 = BVar5;
    }
  }
  else {
    *(undefined8 *)pBVar1 = *(undefined8 *)pBVar17;
    if (0x10 < uVar22) {
      pBVar20 = pBVar20 + 0x10;
      do {
        pBVar17 = pBVar17 + 8;
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
        pBVar20 = pBVar20 + 8;
      } while (pBVar20 < dstEnd);
    }
  }
LAB_0010b8c0:
  bVar4 = (byte)*puVar14;
  puVar26 = (ushort *)((long)puVar14 + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar23 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar26) ||
       (dest + (long)maxOutputSize + -0x20 < dstEnd)) goto LAB_0010b7bb;
    uVar7 = *(undefined8 *)(puVar26 + 4);
    *(undefined8 *)dstEnd = *(undefined8 *)puVar26;
    *(undefined8 *)(dstEnd + 8) = uVar7;
    pBVar20 = dstEnd + uVar23;
    uVar22 = (ulong)(uVar9 & 0xf);
    puVar14 = (ushort *)((long)puVar26 + uVar23) + 1;
    uVar6 = *(ushort *)((long)puVar26 + uVar23);
    uVar12 = (ulong)uVar6;
    pBVar17 = pBVar20 + -uVar12;
    if ((((uVar9 & 0xf) == 0xf) || (uVar6 < 8)) || (pBVar17 < pBVar15)) goto LAB_0010b808;
    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
    *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)(pBVar17 + 8);
    *(undefined2 *)(pBVar20 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
    dstEnd = pBVar20 + uVar22 + 4;
    bVar4 = *(byte *)((long)puVar26 + uVar23 + 2);
    puVar26 = (ushort *)((long)puVar26 + uVar23 + 3);
  }
  if ((ushort *)((long)puVar2 - 0xfU) <= puVar26) goto LAB_0010b8f6;
  pbVar13 = (byte *)((long)puVar26 + 1);
  uVar19 = 0;
  do {
    uVar6 = *puVar26;
    puVar26 = (ushort *)((long)puVar26 + 1);
    uVar19 = uVar19 + (byte)uVar6;
    pbVar13 = pbVar13 + 1;
  } while (puVar26 < (ushort *)((long)puVar2 - 0xfU) && (byte)uVar6 == 0xff);
  uVar23 = (ulong)uVar19 + 0xf;
  if ((CARRY8((ulong)dstEnd,uVar23)) || ((ulong)-(long)pbVar13 < uVar23)) goto LAB_0010b8f6;
LAB_0010b7bb:
  pBVar20 = dstEnd + uVar23;
LAB_0010b7c1:
  puVar14 = (ushort *)((long)puVar26 + uVar23);
  if ((pBVar3 + -0xc < pBVar20) || (puVar2 + -4 < puVar14)) {
    if ((puVar14 == puVar2) && (pBVar20 <= pBVar3)) {
      memmove(dstEnd,puVar26,uVar23);
      return ((int)dstEnd + (int)uVar23) - (int)dest;
    }
    goto LAB_0010b8f6;
  }
  do {
    *(undefined8 *)dstEnd = *(undefined8 *)puVar26;
    dstEnd = dstEnd + 8;
    puVar26 = puVar26 + 4;
  } while (dstEnd < pBVar20);
  uVar12 = (ulong)*puVar14;
  puVar14 = puVar14 + 1;
  pBVar17 = pBVar20 + -uVar12;
  uVar22 = (ulong)(uVar9 & 0xf);
LAB_0010b808:
  if ((int)uVar22 == 0xf) {
    uVar9 = 0;
    do {
      puVar26 = puVar14;
      puVar14 = (ushort *)((long)puVar26 + 1);
      if (puVar2 + -2 <= puVar14) goto LAB_0010b8f3;
      uVar9 = uVar9 + (byte)*puVar26;
    } while ((byte)*puVar26 == 0xff);
    uVar22 = (ulong)uVar9 + 0xf;
    if (CARRY8((ulong)pBVar20,uVar22)) {
LAB_0010b8f3:
      puVar26 = (ushort *)((long)puVar26 + 1);
      goto LAB_0010b8f6;
    }
  }
  uVar22 = uVar22 + 4;
  goto LAB_0010b84d;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}